

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sstring_view.cpp
# Opt level: O0

void __thiscall SStringView_Clear_Test::TestBody(SStringView_Clear_Test *this)

{
  bool bVar1;
  char *pcVar2;
  size_t sVar3;
  raw_sstring_view rVar4;
  AssertHelper local_138;
  Message local_130;
  undefined1 local_128 [8];
  AssertionResult gtest_ar_3;
  Message local_110;
  uint local_104;
  size_type local_100;
  undefined1 local_f8 [8];
  AssertionResult gtest_ar_2;
  sstring_view<const_char_*> sv2;
  Message local_d0;
  undefined1 local_c8 [8];
  AssertionResult gtest_ar_1;
  Message local_b0;
  uint local_a4;
  size_type local_a0;
  undefined1 local_98 [8];
  AssertionResult gtest_ar;
  sstring_view<const_char_*> sv1;
  string local_70 [8];
  string abc_str;
  undefined1 local_40 [8];
  sstring_view<const_char_*> empty;
  string empty_str;
  SStringView_Clear_Test *this_local;
  
  std::__cxx11::string::string((string *)&empty.size_);
  pcVar2 = (char *)std::__cxx11::string::data();
  sVar3 = std::__cxx11::string::length();
  rVar4 = pstore::make_sstring_view(pcVar2,sVar3);
  empty.ptr_ = (char *)rVar4.size_;
  local_40 = (undefined1  [8])rVar4.ptr_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_70,"abc",(allocator *)((long)&sv1.size_ + 7));
  std::allocator<char>::~allocator((allocator<char> *)((long)&sv1.size_ + 7));
  pcVar2 = (char *)std::__cxx11::string::data();
  sVar3 = std::__cxx11::string::length();
  rVar4 = pstore::make_sstring_view(pcVar2,sVar3);
  sv1.ptr_ = (char *)rVar4.size_;
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )rVar4.ptr_;
  pstore::sstring_view<const_char_*>::clear((sstring_view<const_char_*> *)&gtest_ar.message_);
  local_a0 = pstore::sstring_view<const_char_*>::size
                       ((sstring_view<const_char_*> *)&gtest_ar.message_);
  local_a4 = 0;
  testing::internal::EqHelper::Compare<unsigned_long,_unsigned_int,_nullptr>
            ((EqHelper *)local_98,"sv1.size ()","0U",&local_a0,&local_a4);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_98);
  if (!bVar1) {
    testing::Message::Message(&local_b0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_98);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/adt/test_sstring_view.cpp"
               ,0x122,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_b0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_b0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_98);
  testing::internal::EqHelper::
  Compare<pstore::sstring_view<const_char_*>,_pstore::sstring_view<const_char_*>,_nullptr>
            ((EqHelper *)local_c8,"sv1","empty",(sstring_view<const_char_*> *)&gtest_ar.message_,
             (sstring_view<const_char_*> *)local_40);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c8);
  if (!bVar1) {
    testing::Message::Message(&local_d0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_c8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&sv2.size_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/adt/test_sstring_view.cpp"
               ,0x123,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&sv2.size_,&local_d0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&sv2.size_);
    testing::Message::~Message(&local_d0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_c8);
  std::__cxx11::string::~string(local_70);
  pcVar2 = (char *)std::__cxx11::string::data();
  sVar3 = std::__cxx11::string::length();
  rVar4 = pstore::make_sstring_view(pcVar2,sVar3);
  sv2.ptr_ = (char *)rVar4.size_;
  gtest_ar_2.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )rVar4.ptr_;
  pstore::sstring_view<const_char_*>::clear((sstring_view<const_char_*> *)&gtest_ar_2.message_);
  local_100 = pstore::sstring_view<const_char_*>::size
                        ((sstring_view<const_char_*> *)&gtest_ar_2.message_);
  local_104 = 0;
  testing::internal::EqHelper::Compare<unsigned_long,_unsigned_int,_nullptr>
            ((EqHelper *)local_f8,"sv2.size ()","0U",&local_100,&local_104);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_f8);
  if (!bVar1) {
    testing::Message::Message(&local_110);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_f8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/adt/test_sstring_view.cpp"
               ,0x129,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_110);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_110);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_f8);
  testing::internal::EqHelper::
  Compare<pstore::sstring_view<const_char_*>,_pstore::sstring_view<const_char_*>,_nullptr>
            ((EqHelper *)local_128,"sv2","empty",(sstring_view<const_char_*> *)&gtest_ar_2.message_,
             (sstring_view<const_char_*> *)local_40);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_128);
  if (!bVar1) {
    testing::Message::Message(&local_130);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_128);
    testing::internal::AssertHelper::AssertHelper
              (&local_138,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/adt/test_sstring_view.cpp"
               ,0x12a,pcVar2);
    testing::internal::AssertHelper::operator=(&local_138,&local_130);
    testing::internal::AssertHelper::~AssertHelper(&local_138);
    testing::Message::~Message(&local_130);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_128);
  std::__cxx11::string::~string((string *)&empty.size_);
  return;
}

Assistant:

TEST (SStringView, Clear) {
    std::string const empty_str;

    pstore::sstring_view<char const *> empty =
        pstore::make_sstring_view (empty_str.data (), empty_str.length ());
    {
        std::string const abc_str{"abc"};
        pstore::sstring_view<char const *> sv1 =
            pstore::make_sstring_view (abc_str.data (), abc_str.length ());
        sv1.clear ();
        EXPECT_EQ (sv1.size (), 0U);
        EXPECT_EQ (sv1, empty);
    }
    {
        pstore::sstring_view<char const *> sv2 =
            pstore::make_sstring_view (empty_str.data (), empty_str.length ());
        sv2.clear ();
        EXPECT_EQ (sv2.size (), 0U);
        EXPECT_EQ (sv2, empty);
    }
}